

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void __thiscall QApplication::~QApplication(QApplication *this)

{
  QWidget *this_00;
  QWidgetMapper *pQVar1;
  QWidgetSet *this_01;
  ulong uVar2;
  Type *this_02;
  EVP_PKEY_CTX *pEVar3;
  QFont *pQVar4;
  EVP_PKEY_CTX *ctx;
  ulong uVar5;
  QWidgetSet *mySet;
  Data *pDVar6;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007e56f0;
  qt_call_post_routines();
  QBasicTimer::stop();
  QBasicTimer::stop();
  pQVar1 = QWidgetPrivate::mapper;
  QCoreApplicationPrivate::is_app_closing._0_1_ = 1;
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  if (QWidgetPrivate::mapper != (QWidgetMapper *)0x0) {
    QHash<unsigned_long_long,_QWidget_*>::~QHash(QWidgetPrivate::mapper);
  }
  operator_delete(pQVar1,8);
  this_01 = QWidgetPrivate::allWidgets;
  QWidgetPrivate::mapper = (QWidgetMapper *)0x0;
  if (QWidgetPrivate::allWidgets == (QWidgetSet *)0x0) goto LAB_002b9dbb;
  QWidgetPrivate::allWidgets = (QWidgetSet *)0x0;
  pDVar6 = (this_01->q_hash).d;
  if (pDVar6 == (Data *)0x0) {
    pDVar6 = (Data *)0x0;
    uVar5 = 0;
LAB_002b9d0b:
    if (pDVar6 != (Data *)0x0 || uVar5 != 0) goto LAB_002b9d17;
  }
  else {
    if (pDVar6->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (pDVar6->numBuckets == uVar5) {
          pDVar6 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar2 = uVar5 + 1;
      } while (pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      goto LAB_002b9d0b;
    }
    uVar5 = 0;
LAB_002b9d17:
    do {
      this_00 = *(QWidget **)
                 pDVar6->spans[uVar5 >> 7].entries
                 [pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].storage.data;
      if (*(long *)(*(long *)&this_00->field_0x8 + 0x10) == 0) {
        QWidget::destroy(this_00,true,true);
      }
      do {
        if (pDVar6->numBuckets - 1 == uVar5) {
          pDVar6 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while ((pDVar6 != (Data *)0x0) || (uVar5 != 0));
  }
  QHash<QWidget_*,_QHashDummyValue>::~QHash(&this_01->q_hash);
  operator_delete(this_01,8);
LAB_002b9dbb:
  if (qt_desktopWidget != (QWidget *)0x0) {
    (**(code **)(*(long *)qt_desktopWidget + 0x20))();
  }
  qt_desktopWidget = (QWidget *)0x0;
  QHash<QByteArray,_QPalette>::clear(&QApplicationPrivate::widgetPalettes);
  pQVar4 = QApplicationPrivate::sys_font;
  if (QApplicationPrivate::sys_font != (QFont *)0x0) {
    QFont::~QFont(QApplicationPrivate::sys_font);
  }
  operator_delete(pQVar4,0x10);
  pQVar4 = QApplicationPrivate::set_font;
  QApplicationPrivate::sys_font = (QFont *)0x0;
  if (QApplicationPrivate::set_font != (QFont *)0x0) {
    QFont::~QFont(QApplicationPrivate::set_font);
  }
  operator_delete(pQVar4,0x10);
  QApplicationPrivate::set_font = (QFont *)0x0;
  if ((__atomic_base<signed_char>)
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>::guard._q_value.
      super___atomic_base<signed_char>._M_i == -1) {
    this_02 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::
              operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                          *)pQVar4);
    QHash<QByteArray,_QFont>::clear(this_02);
  }
  ctx = (EVP_PKEY_CTX *)QApplicationPrivate::app_style;
  if (QApplicationPrivate::app_style != (QStyle *)0x0) {
    (**(code **)(*(long *)QApplicationPrivate::app_style + 0x20))();
    ctx = (EVP_PKEY_CTX *)QApplicationPrivate::app_style;
  }
  QApplicationPrivate::app_style = (QStyle *)0x0;
  if ((qt_is_tty_app == '\0') &&
     (pEVar3 = (EVP_PKEY_CTX *)QDragManager::self(), pEVar3 != (EVP_PKEY_CTX *)0x0)) {
    (**(code **)(*(long *)pEVar3 + 0x20))();
    ctx = pEVar3;
  }
  QPixmapCache::clear();
  QColormap::cleanup(ctx);
  QApplicationPrivate::active_window = (QWidget *)0x0;
  if (QApplicationPrivate::widgetCount == true) {
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_30 = "default";
    QMessageLogger::debug
              (local_48,"Widgets left: %i    Max widgets: %i \n",
               (ulong)(uint)QWidgetPrivate::instanceCounter,
               (ulong)(uint)QWidgetPrivate::maxInstances);
  }
  QGuiApplicationPrivate::obey_desktop_settings._0_1_ = 1;
  QApplicationPrivate::enabledAnimations = 1;
  QApplicationPrivate::widgetCount = false;
  QGuiApplication::~QGuiApplication(&this->super_QGuiApplication);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QApplication::~QApplication()
{
    Q_D(QApplication);

    //### this should probable be done even later
    qt_call_post_routines();

    // kill timers before closing down the dispatcher
    d->toolTipWakeUp.stop();
    d->toolTipFallAsleep.stop();

    QApplicationPrivate::is_app_closing = true;
    QApplicationPrivate::is_app_running = false;

    delete QWidgetPrivate::mapper;
    QWidgetPrivate::mapper = nullptr;

    // delete all widgets
    if (QWidgetPrivate::allWidgets) {
        QWidgetSet *mySet = QWidgetPrivate::allWidgets;
        QWidgetPrivate::allWidgets = nullptr;
        for (QWidgetSet::ConstIterator it = mySet->constBegin(), cend = mySet->constEnd(); it != cend; ++it) {
            QWidget *w = *it;
            if (!w->parent())                        // window
                w->destroy(true, true);
        }
        delete mySet;
    }

    delete qt_desktopWidget;
    qt_desktopWidget = nullptr;

    QApplicationPrivate::widgetPalettes.clear();

    delete QApplicationPrivate::sys_font;
    QApplicationPrivate::sys_font = nullptr;
    delete QApplicationPrivate::set_font;
    QApplicationPrivate::set_font = nullptr;
    if (app_fonts.exists())
        app_fonts()->clear();

    delete QApplicationPrivate::app_style;
    QApplicationPrivate::app_style = nullptr;

#if QT_CONFIG(draganddrop)
    if (!qt_is_tty_app)
        delete QDragManager::self();
#endif

    d->cleanupMultitouch();

    QPixmapCache::clear();
    QColormap::cleanup();

    QApplicationPrivate::active_window = nullptr; //### this should not be necessary

    if (QApplicationPrivate::widgetCount)
        qDebug("Widgets left: %i    Max widgets: %i \n", QWidgetPrivate::instanceCounter, QWidgetPrivate::maxInstances);

    QApplicationPrivate::obey_desktop_settings = true;

    QApplicationPrivate::enabledAnimations = QPlatformTheme::GeneralUiEffect;
    QApplicationPrivate::widgetCount = false;
}